

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexPattern.cpp
# Opt level: O2

Type __thiscall UnifiedRegex::RegexPattern::EnsureTestCache(RegexPattern *this)

{
  Recycler *alloc;
  RegExpTestCache *ptr;
  long in_RSI;
  undefined1 local_40 [8];
  TrackAllocData data;
  
  if (*(long *)(in_RSI + 8) == 0) {
    local_40 = (undefined1  [8])&RegExpTestCache::typeinfo;
    data.typeinfo = (type_info *)0x40;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_a5d89a2;
    data.filename._0_4_ = 0x97;
    alloc = Memory::Recycler::TrackAllocInfo
                      (*(Recycler **)(*(long *)(in_RSI + 0x10) + 0x4e8),(TrackAllocData *)local_40);
    ptr = (RegExpTestCache *)new<Memory::Recycler>(8,alloc,0x398e98,0);
    (ptr->resultBV).data[0].word = 0;
    Memory::WriteBarrierPtr<UnifiedRegex::RegExpTestCache>::WriteBarrierSet
              ((WriteBarrierPtr<UnifiedRegex::RegExpTestCache> *)(in_RSI + 8),ptr);
  }
  Memory::WriteBarrierPtr<UnifiedRegex::RegExpTestCache>::WriteBarrierPtr
            ((WriteBarrierPtr<UnifiedRegex::RegExpTestCache> *)this,
             (WriteBarrierPtr<UnifiedRegex::RegExpTestCache> *)(in_RSI + 8));
  return (Type)(RegExpTestCache *)this;
}

Assistant:

RegexPattern::EnsureTestCache()
    {
        if (this->testCache == nullptr)
        {
            this->testCache = RecyclerNewPlusZ(this->library->GetRecycler(), TestCacheSize * sizeof(void*), RegExpTestCache);
        }
        return this->testCache;
    }